

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O2

void __thiscall Fl_Input::draw(Fl_Input *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Boxtype t;
  
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 7) == 3) {
    return;
  }
  t = (Fl_Boxtype)(this->super_Fl_Input_).super_Fl_Widget.box_;
  if ((char)(this->super_Fl_Input_).super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this,t,(this->super_Fl_Input_).super_Fl_Widget.color_);
  }
  iVar1 = (this->super_Fl_Input_).super_Fl_Widget.x_;
  iVar5 = Fl::box_dx(t);
  iVar2 = (this->super_Fl_Input_).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy(t);
  iVar3 = (this->super_Fl_Input_).super_Fl_Widget.w_;
  iVar7 = Fl::box_dw(t);
  iVar4 = (this->super_Fl_Input_).super_Fl_Widget.h_;
  iVar8 = Fl::box_dh(t);
  Fl_Input_::drawtext(&this->super_Fl_Input_,iVar1 + iVar5,iVar2 + iVar6,iVar3 - iVar7,iVar4 - iVar8
                     );
  return;
}

Assistant:

uchar type() const {return type_;}